

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::wait_for_start_deregistration
          (coop_repo_t *this)

{
  mutex *__m;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lck;
  coop_repo_t *this_local;
  
  lck._8_8_ = this;
  __m = so_5::impl::coop_repository_basis_t::lock(&this->super_coop_repository_basis_t);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,__m);
  std::condition_variable::
  wait<so_5::env_infrastructures::default_mt::impl::coop_repo_t::wait_for_start_deregistration()::__0>
            (&this->m_deregistration_started_cond,(unique_lock<std::mutex> *)local_20,
             (anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void
coop_repo_t::wait_for_start_deregistration()
{
	std::unique_lock< std::mutex > lck( this->lock() );

	m_deregistration_started_cond.wait( lck,
			[this] { return m_deregistration_started; } );
}